

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O3

int Potassco::xconvert<Clasp::OptParams::UscOption>
              (char *x,Set<Clasp::OptParams::UscOption> *out,char **errPos,int e)

{
  uint uVar1;
  int iVar2;
  KV *pKVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  uint n;
  char *next;
  Set<Clasp::OptParams::UscOption> local_44;
  char *local_40;
  Set<Clasp::OptParams::UscOption> *local_38;
  
  uVar5 = 0;
  iVar2 = xconvert(x,&local_44.val,&local_40,0);
  local_38 = out;
  if (iVar2 == 0) {
    local_40 = "";
    local_44.val = 0;
    pKVar3 = findValue((Potassco *)&Clasp::enumMap(Clasp::OptParams::UscOption_const*)::map,
                       (Span<Potassco::KV> *)0x3,x,&local_40,",");
    if (pKVar3 == (KV *)0x0) goto LAB_00127220;
    uVar5 = 0;
    do {
      x = local_40;
      local_44.val = local_44.val | pKVar3->value;
      uVar5 = uVar5 + 1;
      pKVar3 = findValue((Potassco *)&Clasp::enumMap(Clasp::OptParams::UscOption_const*)::map,
                         (Span<Potassco::KV> *)0x3,local_40 + (*local_40 == ','),&local_40,",");
    } while (pKVar3 != (KV *)0x0);
  }
  else {
    lVar4 = 0;
    uVar5 = 0;
    do {
      uVar1 = *(uint *)((long)&DAT_001e66a8 + lVar4);
      uVar5 = uVar1 | uVar5;
      bVar6 = (local_44.val & ~uVar5) == 0;
      if (lVar4 == 0x20) break;
      lVar4 = lVar4 + 0x10;
    } while ((!bVar6 || local_44.val == 0) && local_44.val != uVar1);
    uVar5 = (uint)(bVar6 && local_44.val != 0 || local_44.val == uVar1);
  }
  if (uVar5 == 0) {
    uVar5 = 0;
  }
  else {
    local_38->val = local_44.val;
    x = local_40;
  }
LAB_00127220:
  if (errPos != (char **)0x0) {
    *errPos = x;
  }
  return uVar5;
}

Assistant:

static int xconvert(const char* x, Set<ET>& out, const char** errPos, int e) {
	const char* it = x, *next;
	unsigned n, len = 0u; ET v;
	if (xconvert(it, n, &next, e)) {
		const Potassco::Span<Potassco::KV> em = enumMap(static_cast<ET*>(0));
		for (size_t i = 0, sum = 0; i != em.size && !len; ++i) {
			sum |= static_cast<unsigned>(em[i].value);
			len += (n == static_cast<unsigned>(em[i].value)) || (n && (n & sum) == n);
		}
	}
	else {
		for (next = "", n = 0u; xconvert(it + int(*next == ','), v, &next, e); it = next, ++len) {
			n |= static_cast<unsigned>(v);
		}
	}
	if (len)    { out.val = n; it = next; }
	if (errPos) { *errPos = it; }
	return static_cast<int>(len);
}